

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

int Abc_NtkDontCareTransfer(Odc_Man_t *p)

{
  ulong uVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long lVar5;
  ushort iFan1;
  Odc_Lit_t OVar6;
  Odc_Lit_t OVar7;
  int *__s;
  Vec_Ptr_t *pVVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  
  pAVar3 = p->pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar10 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar10 + 500;
    iVar14 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar14) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar14;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar10) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar14;
  }
  iVar10 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar8 = p->vLeaves;
  if (0 < pVVar8->nSize) {
    uVar12 = 2;
    lVar13 = 0;
    do {
      if (p->nPis <= lVar13) goto LAB_00285c5d;
      plVar4 = (long *)pVVar8->pArray[lVar13];
      uVar11 = (uVar12 & 0xfffe) << 0x10 | uVar12 & 0xfffe;
      plVar4[8] = (long)(int)uVar11;
      lVar5 = *plVar4;
      iVar10 = (int)plVar4[2];
      uVar2 = *(undefined4 *)(lVar5 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,uVar11);
      if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_00285c3e;
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) = uVar2;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vLeaves;
      uVar12 = uVar12 + 2;
    } while (lVar13 < pVVar8->nSize);
  }
  pVVar8 = p->vBranches;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      iVar10 = p->nVarsMax + (int)lVar13;
      if ((iVar10 < 0) || (p->nPis <= iVar10)) {
LAB_00285c5d:
        __assert_fail("i >= 0 && i < p->nPis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                      ,0x72,"Odc_Lit_t Odc_Var(Odc_Man_t *, int)");
      }
      plVar4 = (long *)pVVar8->pArray[lVar13];
      uVar12 = iVar10 * 2 + 2;
      uVar11 = uVar12 & 0xffff;
      plVar4[8] = (long)(int)(uVar12 * 0x10000 | uVar11);
      lVar5 = *plVar4;
      iVar10 = (int)plVar4[2];
      uVar2 = *(undefined4 *)(lVar5 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,uVar11);
      if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) {
LAB_00285c3e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) = uVar2;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vBranches;
    } while (lVar13 < pVVar8->nSize);
  }
  p->iRoot = 1;
  pVVar8 = p->vRoots;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      pvVar9 = Abc_NtkDontCareTransfer_rec(p,(Abc_Obj_t *)pVVar8->pArray[lVar13],p->pNode);
      iFan1 = (ushort)((ulong)pvVar9 >> 0x10);
      OVar6 = Odc_And(p,(Odc_Lit_t)pvVar9,iFan1 ^ 1);
      OVar7 = Odc_And(p,(Odc_Lit_t)pvVar9 ^ 1,iFan1);
      OVar6 = Odc_And(p,OVar6 ^ 1,OVar7 ^ 1);
      OVar6 = Odc_And(p,p->iRoot ^ 1,OVar6);
      p->iRoot = OVar6 ^ 1;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vRoots;
    } while (lVar13 < pVVar8->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkDontCareTransfer( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    Odc_Lit_t uRes0, uRes1;
    Odc_Lit_t uLit;
    unsigned uData;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    // set elementary variables at the leaves 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
    {
        uLit = Odc_Var( p, i );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // set elementary variables at the branched 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
    {
        uLit = Odc_Var( p, i+p->nVarsMax );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // compute the AIG for the window
    p->iRoot = Odc_Const0();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        uData = (unsigned)(ABC_PTRUINT_T)Abc_NtkDontCareTransfer_rec( p, pObj, p->pNode );
        // get the cofactors
        uRes0 = uData & 0xffff;
        uRes1 = uData >> 16;
        // compute the miter
//        assert( uRes0 != uRes1 ); // may be false if the node is redundant w.r.t. this root
        uLit = Odc_Xor( p, uRes0, uRes1 );
        p->iRoot = Odc_Or( p, p->iRoot, uLit );
    }
    return 1;
}